

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

int netaddr_cmp_to_socket(netaddr *a1,netaddr_socket *a2)

{
  int iVar1;
  int local_24;
  int result;
  netaddr_socket *a2_local;
  netaddr *a1_local;
  
  local_24 = (uint)a1->_type - (uint)(a2->v4).sin_family;
  a1_local._4_4_ = local_24;
  if (local_24 == 0) {
    if (a1->_type == '\x02') {
      local_24 = memcmp(a1,&(a2->v4).sin_addr,4);
    }
    else if (a1->_type == '\n') {
      local_24 = memcmp(a1,(a2->v4).sin_zero,0x10);
    }
    if (local_24 == 0) {
      iVar1 = 0x80;
      if (a1->_type == '\x02') {
        iVar1 = 0x20;
      }
      a1_local._4_4_ = (uint)a1->_prefix_len - iVar1;
    }
    else {
      a1_local._4_4_ = local_24;
    }
  }
  return a1_local._4_4_;
}

Assistant:

int
netaddr_cmp_to_socket(const struct netaddr *a1, const union netaddr_socket *a2) {
  int result = 0;

  result = (int)a1->_type - (int)a2->std.sa_family;
  if (result) {
    return result;
  }

  if (a1->_type == AF_INET) {
    result = memcmp(a1->_addr, &a2->v4.sin_addr, 4);
  }
  else if (a1->_type == AF_INET6) {
    /* ipv6 */
    result = memcmp(a1->_addr, &a2->v6.sin6_addr, 16);
  }

  if (result) {
    return result;
  }

  return (int)a1->_prefix_len - (a1->_type == AF_INET ? 32 : 128);
}